

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

string * __thiscall
TypeOpIntZext::getOperatorName_abi_cxx11_
          (string *__return_storage_ptr__,TypeOpIntZext *this,PcodeOp *op)

{
  ostream *this_00;
  void *this_01;
  ostringstream s;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aoStack_198,
                       (this->super_TypeOpFunc).super_TypeOp.name._M_dataplus._M_p,
                       (this->super_TypeOpFunc).super_TypeOp.name._M_string_length);
  *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
       *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) & 0xffffffb5 | 2;
  this_01 = (void *)std::ostream::operator<<
                              (this_00,(*(op->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->size);
  std::ostream::operator<<(this_01,op->output->size);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string TypeOpIntZext::getOperatorName(const PcodeOp *op) const

{
  ostringstream s;
  
  s << name << dec << op->getIn(0)->getSize() << op->getOut()->getSize();
  return s.str();
}